

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenRefCount.hpp
# Opt level: O0

void __thiscall
antlr::TokenRefCount<antlr::Token>::~TokenRefCount(TokenRefCount<antlr::Token> *this)

{
  bool bVar1;
  long *in_RDI;
  TokenRef *this_00;
  
  if (((*in_RDI != 0) && (bVar1 = TokenRef::decrement((TokenRef *)*in_RDI), bVar1)) &&
     (this_00 = (TokenRef *)*in_RDI, this_00 != (TokenRef *)0x0)) {
    TokenRef::~TokenRef(this_00);
    operator_delete(this_00,0x10);
  }
  return;
}

Assistant:

~TokenRefCount()
	{
		if (ref && ref->decrement())
			delete ref;
	}